

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_message.c
# Opt level: O0

TsStatus_t ts_message_destroy(TsMessageRef_t message)

{
  int local_1c;
  int i;
  TsMessageRef_t message_local;
  
  if ((message == (TsMessageRef_t)0x0) || (message->references < 1)) {
    message_local._4_4_ = TsStatusErrorPreconditionFailed;
  }
  else {
    message->references = message->references + -1;
    if (message->references < 1) {
      if ((message->type == TsTypeArray) || (message->type == TsTypeMessage)) {
        for (local_1c = 0; local_1c < 0xf; local_1c = local_1c + 1) {
          if (*(long *)(message->name + (long)local_1c * 8 + 0x1c) != 0) {
            ts_message_destroy(*(TsMessageRef_t *)(message->name + (long)local_1c * 8 + 0x1c));
          }
        }
      }
      free(message);
    }
    message_local._4_4_ = TsStatusOk;
  }
  return message_local._4_4_;
}

Assistant:

TsStatus_t ts_message_destroy(TsMessageRef_t message)
{
	/* check preconditions */
	if (message == NULL || message->references <= 0) {
		return TsStatusErrorPreconditionFailed;
	}

	/* simply change its status */
	message->references--;

	/* and destroy along with children */
	if (message->references <= 0) {

		if (message->type == TsTypeArray || message->type == TsTypeMessage) {
			for (int i = 0; i < TS_MESSAGE_MAX_BRANCHES; i++) {
				if (message->value._xfields[i] != NULL) {
					ts_message_destroy(message->value._xfields[i]);
				}
			}
		}
#ifdef TS_MESSAGE_STATIC_MEMORY
		message->references = 0;
		_ts_message_counter--;
		if (_ts_message_counter <= 0) {
			dbg_printf("ts_message_destroy: all messages that had been created are now destroyed\n");
		}
#else
		free(message);
#endif
	}

	/* return ok */
	return TsStatusOk;
}